

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void singlevar(LexState *ls,expdesc *var)

{
  TString *n;
  undefined1 local_40 [8];
  expdesc key;
  FuncState *fs;
  TString *varname;
  expdesc *var_local;
  LexState *ls_local;
  
  n = str_checkname(ls);
  key._16_8_ = ls->fs;
  singlevaraux((FuncState *)key._16_8_,n,var,1);
  if (var->k == VVOID) {
    singlevaraux((FuncState *)key._16_8_,ls->envn,var,1);
    luaK_exp2anyregup((FuncState *)key._16_8_,var);
    codestring((expdesc *)local_40,n);
    luaK_indexed((FuncState *)key._16_8_,var,(expdesc *)local_40);
  }
  return;
}

Assistant:

static void singlevar (LexState *ls, expdesc *var) {
  TString *varname = str_checkname(ls);
  FuncState *fs = ls->fs;
  singlevaraux(fs, varname, var, 1);
  if (var->k == VVOID) {  /* global name? */
    expdesc key;
    singlevaraux(fs, ls->envn, var, 1);  /* get environment variable */
    lua_assert(var->k != VVOID);  /* this one must exist */
    luaK_exp2anyregup(fs, var);  /* but could be a constant */
    codestring(&key, varname);  /* key is variable name */
    luaK_indexed(fs, var, &key);  /* env[varname] */
  }
}